

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_digest.c
# Opt level: O2

void warn_all_untested(void)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  ENGINE *e;
  ENGINE_DIGESTS_PTR pEVar6;
  EVP_MD *pEVar7;
  long lVar8;
  size_t sVar9;
  size_t sVar10;
  HMAC_CTX *ctx;
  EVP_MD_CTX *pEVar11;
  undefined8 uVar12;
  long lVar13;
  void *pvVar14;
  EVP_MD_CTX *ctx_00;
  ENGINE *unaff_RBX;
  ulong uVar15;
  hash_testvec *phVar16;
  char *pcVar17;
  char *pcVar18;
  char **__s;
  size_t sVar19;
  size_t sVar20;
  char *pcVar21;
  void *d;
  ulong uVar22;
  char *pcVar23;
  uchar *md;
  bool bVar24;
  int *nids;
  EVP_MD *pEStack_280;
  EVP_MD *pEStack_278;
  long lStack_270;
  ulong uStack_268;
  size_t sStack_260;
  void *pvStack_258;
  uchar *puStack_250;
  char *pcStack_248;
  hash_testvec *phStack_240;
  uint uStack_238;
  uint uStack_234;
  char *pcStack_230;
  void *pvStack_228;
  ulong uStack_220;
  int *piStack_218;
  char *pcStack_210;
  long lStack_208;
  undefined8 uStack_200;
  uint uStack_1f8;
  uint uStack_1f4;
  char *pcStack_1f0;
  char *pcStack_1e8;
  char *pcStack_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined8 uStack_1c0;
  undefined8 uStack_1b8;
  char *apcStack_100 [5];
  char *pcStack_d8;
  undefined8 uStack_d0;
  char *pcStack_c8;
  char *pcStack_c0;
  char *pcStack_b8;
  char *apcStack_b0 [11];
  ENGINE *pEStack_58;
  int *local_20;
  
  iVar1 = engine_is_available("gost");
  e = unaff_RBX;
  if (iVar1 == 0) {
LAB_001036ab:
    iVar1 = OSSL_PROVIDER_available(0,"gostprov");
    if (iVar1 == 0) {
      return;
    }
    lVar8 = OSSL_PROVIDER_load(0,"gostprov");
    if (lVar8 != 0) {
      EVP_MD_do_all_provided(0,warn_if_untested,lVar8);
      OSSL_PROVIDER_unload(lVar8);
      return;
    }
LAB_00103744:
    ERR_print_errors_fp(_stderr);
    OPENSSL_die("prov = OSSL_PROVIDER_load(NULL, \"gostprov\")",
                "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
                ,0x3b3);
  }
  else {
    e = ENGINE_by_id("gost");
    if (e == (ENGINE *)0x0) {
      ERR_print_errors_fp(_stderr);
      OPENSSL_die("eng = ENGINE_by_id(\"gost\")",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
                  ,0x3a3);
LAB_0010371d:
      ERR_print_errors_fp(_stderr);
      OPENSSL_die("ENGINE_init(eng)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
                  ,0x3a4);
      e = unaff_RBX;
      goto LAB_00103744;
    }
    iVar1 = ENGINE_init(e);
    unaff_RBX = e;
    if (iVar1 == 0) goto LAB_0010371d;
    pEVar6 = ENGINE_get_digests(e);
    if (pEVar6 != (ENGINE_DIGESTS_PTR)0x0) {
      uVar22 = 0;
      uVar2 = (*pEVar6)(e,(EVP_MD **)0x0,&local_20,0);
      uVar15 = (ulong)uVar2;
      if ((int)uVar2 < 1) {
        uVar15 = uVar22;
      }
      for (; uVar15 != uVar22; uVar22 = uVar22 + 1) {
        pEVar7 = ENGINE_get_digest(e,local_20[uVar22]);
        warn_if_untested((EVP_MD *)pEVar7,(void *)0x0);
      }
      ENGINE_finish(e);
      ENGINE_free(e);
      goto LAB_001036ab;
    }
  }
  ERR_print_errors_fp(_stderr);
  OPENSSL_die("fn_c = ENGINE_get_digests(eng)",
              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
              ,0x3a7);
  pEStack_58 = e;
  OPENSSL_init_crypto(0x4c,0);
  phVar16 = testvecs;
  uStack_238 = 0;
  while( true ) {
    pcVar23 = phVar16->algname;
    if (pcVar23 == (char *)0x0) {
      warn_all_untested();
      pcVar23 = "\x1b[0;31m= Some tests FAILED!\x1b[m";
      if (uStack_238 == 0) {
        pcVar23 = "\x1b[0;32m= All tests passed!\x1b[m";
      }
      puts(pcVar23);
      return;
    }
    pcStack_210 = phVar16->plaintext;
    phStack_240 = phVar16;
    pcStack_230 = pcVar23;
    if (pcStack_210 != (char *)0x0) break;
    uVar15 = 0;
    printf("\x1b[1;34mTest %s: \x1b[m",phVar16->name);
    fflush(_stdout);
    lStack_270 = 0x100;
    bVar24 = false;
    while ((uVar15 < 0x10 && (!bVar24))) {
      pvVar14 = (void *)CRYPTO_zalloc(uVar15 | 0x100,
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
                                      ,0x324);
      if (pvVar14 == (void *)0x0) goto LAB_00104840;
      lVar8 = 0;
      while( true ) {
        uStack_200 = (char *)CONCAT44(uStack_200._4_4_,(int)lVar8);
        if (lVar8 == 0x100) break;
        ((uchar *)((long)pvVar14 + uVar15))[lVar8] = (uchar)lVar8;
        lVar8 = lVar8 + 1;
      }
      pEStack_280 = EVP_get_digestbyname(pcVar23);
      if ((pEStack_280 == (EVP_MD *)0x0) &&
         (pEStack_280 = (EVP_MD *)EVP_MD_fetch(0,pcVar23,0), pEStack_280 == (EVP_MD *)0x0))
      goto LAB_00104a89;
      iVar1 = EVP_MD_is_a(pEStack_280,pcVar23);
      if (iVar1 == 0) goto LAB_00104828;
      pEVar11 = (EVP_MD_CTX *)EVP_MD_CTX_new();
      if (pEVar11 == (EVP_MD_CTX *)0x0) goto LAB_001047e9;
      puStack_250 = (uchar *)((long)pvVar14 + uVar15);
      ctx_00 = (EVP_MD_CTX *)EVP_MD_CTX_new();
      if (ctx_00 == (EVP_MD_CTX *)0x0) goto LAB_00104783;
      iVar1 = EVP_DigestInit(ctx_00,pEStack_280);
      if (iVar1 == 0) goto LAB_001047aa;
      pEVar7 = EVP_MD_CTX_md(ctx_00);
      iVar1 = EVP_MD_is_a(pEVar7,pcVar23);
      if (iVar1 == 0) goto LAB_00104810;
      iVar1 = EVP_MD_get_block_size(pEStack_280);
      if (iVar1 != phVar16->block_size) goto LAB_001047d1;
      uVar12 = EVP_MD_CTX_get0_md(ctx_00);
      iVar3 = EVP_MD_get_size(uVar12);
      sVar9 = (size_t)iVar3;
      if (phVar16->outsize != sVar9) goto LAB_0010476b;
      uVar12 = EVP_MD_CTX_get0_md(ctx_00);
      iVar3 = EVP_MD_get_block_size(uVar12);
      if (iVar3 != iVar1) goto LAB_0010473b;
      uVar2 = EVP_MD_get_size(pEStack_280);
      if (sVar9 != uVar2) goto LAB_00104753;
      pcVar23 = (char *)CRYPTO_zalloc(uVar2 + (int)uVar15,
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
                                      ,0x33a);
      if (pcVar23 == (char *)0x0) goto LAB_00104867;
      md = (uchar *)(pcVar23 + uVar15);
      d = (void *)((long)pvVar14 + lStack_270);
      sVar20 = 0;
      pvStack_258 = pvVar14;
      pcStack_248 = pcVar23;
      pvStack_228 = (void *)(ulong)uVar2;
      while (sVar20 != 0x100) {
        iVar1 = EVP_DigestInit(pEVar11,pEStack_280);
        if (iVar1 == 0) {
          ERR_print_errors_fp(_stderr);
          OPENSSL_die("EVP_DigestInit(ctx, dgst)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
                      ,0x340);
LAB_0010462a:
          ERR_print_errors_fp(_stderr);
          OPENSSL_die("EVP_DigestUpdate(ctx, ibuf + shifts + SUPER_SIZE - len, len)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
                      ,0x341);
LAB_00104651:
          ERR_print_errors_fp(_stderr);
          OPENSSL_die("EVP_DigestFinal(ctx, md, NULL)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
                      ,0x342);
          goto LAB_00104678;
        }
        iVar1 = EVP_DigestUpdate(pEVar11,d,sVar20);
        if (iVar1 == 0) goto LAB_0010462a;
        iVar1 = EVP_DigestFinal(pEVar11,md,(uint *)0x0);
        if (iVar1 == 0) goto LAB_00104651;
        iVar1 = EVP_DigestUpdate(ctx_00,md,sVar9);
        sVar20 = sVar20 + 1;
        d = (void *)((long)d + -1);
        if (iVar1 == 0) {
LAB_00104678:
          ERR_print_errors_fp(_stderr);
          OPENSSL_die("EVP_DigestUpdate(ctx2, md, mdlen)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
                      ,0x343);
          goto LAB_0010469f;
        }
      }
      sVar20 = 0;
      while (sVar20 != 0x100) {
        iVar1 = EVP_DigestInit(pEVar11,pEStack_280);
        if (iVar1 == 0) goto LAB_0010469f;
        iVar1 = EVP_DigestUpdate(pEVar11,puStack_250,sVar20);
        if (iVar1 == 0) goto LAB_001046c6;
        iVar1 = EVP_DigestFinal(pEVar11,md,(uint *)0x0);
        if (iVar1 == 0) goto LAB_001046ed;
        iVar1 = EVP_DigestUpdate(ctx_00,md,sVar9);
        sVar20 = sVar20 + 1;
        if (iVar1 == 0) goto LAB_00104714;
      }
      uStack_200 = (char *)CONCAT44(uStack_200._4_4_,0x100);
      CRYPTO_free(pvStack_258);
      EVP_MD_CTX_free(pEVar11);
      iVar1 = EVP_DigestFinal(ctx_00,md,(uint *)&uStack_200);
      if (iVar1 == 0) goto LAB_0010488e;
      EVP_MD_CTX_free(ctx_00);
      EVP_MD_free(pEStack_280);
      if ((uint)uStack_200 == (uint)pvStack_228) {
        iVar1 = bcmp(md,phStack_240->digest,sVar9);
        if (iVar1 != 0) {
          puts("\x1b[1;31mdigest mismatch\x1b[m");
          printf("  Expected value is: ");
          for (sVar20 = 0; sVar9 != sVar20; sVar20 = sVar20 + 1) {
            printf("\\x%02x",(ulong)md[sVar20]);
          }
          putchar(10);
          goto LAB_001044d9;
        }
        CRYPTO_free(pcStack_248);
        bVar24 = false;
        pcVar23 = pcStack_230;
      }
      else {
        printf("\x1b[1;31mdigest output len mismatch %u != %u (expected)\x1b[m\n");
LAB_001044d9:
        pcVar23 = pcStack_230;
        CRYPTO_free(pcStack_248);
        EVP_MD_free(pEStack_280);
        bVar24 = true;
      }
      uVar15 = uVar15 + 1;
      lStack_270 = lStack_270 + 1;
      phVar16 = phStack_240;
    }
    pcVar23 = "\x1b[1;31mfail\x1b[m";
    if (!bVar24) {
      pcVar23 = "\x1b[1;32msuccess\x1b[m";
    }
    puts(pcVar23);
LAB_0010459c:
    phVar16 = phVar16 + 1;
  }
  ERR_set_mark();
  pEStack_278 = EVP_get_digestbyname(pcVar23);
  if ((pEStack_278 == (EVP_MD *)0x0) &&
     (pEStack_278 = (EVP_MD *)EVP_MD_fetch(0,pcVar23,0), pEStack_278 == (EVP_MD *)0x0)) {
    pvStack_258 = (void *)EVP_MAC_fetch(0,pcVar23,0);
    if (pvStack_258 == (void *)0x0) goto LAB_00104f1b;
    pEStack_278 = (EVP_MD *)0x0;
  }
  else {
    pvStack_258 = (void *)0x0;
  }
  ERR_pop_to_mark();
  printf("\x1b[1;34mTest %s: %s: \x1b[m",pcVar23,phVar16->name);
  sVar9 = (size_t)phVar16->psize;
  pvStack_228 = CRYPTO_malloc(phVar16->psize + 0x20,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
                              ,0x2fb);
  if (pvStack_228 != (void *)0x0) {
    piStack_218 = &phVar16->acpkm_t;
    uVar15 = 0;
    do {
      uVar22 = uVar15;
      if (uVar22 == 0x20) {
        uVar2 = 0;
        goto LAB_00104553;
      }
      puStack_250 = (uchar *)((long)pvStack_228 + uVar22);
      memcpy(puStack_250,pcStack_210,sVar9);
      if (pvStack_258 == (void *)0x0) {
LAB_00103aff:
        uVar2 = 0;
      }
      else {
        if (uVar22 == 0) {
          printf("[MAC %zu] ");
        }
        iVar1 = phVar16->acpkm;
        iVar3 = phVar16->acpkm_t;
        lStack_208 = (long)iVar3;
        __s = apcStack_100;
        sStack_260 = (long)iVar1;
        memset(__s,0,0xa0);
        if ((long)iVar1 != 0) {
          OSSL_PARAM_construct_size_t(apcStack_100,"key-mesh",&sStack_260);
          __s = &pcStack_d8;
          if (iVar3 != 0) {
            OSSL_PARAM_construct_size_t(&uStack_200,"cipher-key-mesh",&lStack_208);
            pcStack_b8 = pcStack_1e0;
            uStack_d0 = CONCAT44(uStack_1f4,uStack_1f8);
            pcStack_c8 = pcStack_1f0;
            pcStack_c0 = pcStack_1e8;
            pcStack_d8 = uStack_200;
            __s = apcStack_b0;
          }
        }
        lVar8 = EVP_MAC_CTX_new(pvStack_258);
        if (lVar8 == 0) goto LAB_001049c6;
        sVar19 = phVar16->outsize;
        if ((sVar19 != 0) && (sVar10 = EVP_MAC_CTX_get_mac_size(lVar8), sVar10 != sVar19))
        goto LAB_00104afe;
        iVar1 = phVar16->truncate;
        if ((long)iVar1 == 0) {
          uStack_268 = EVP_MAC_CTX_get_mac_size(lVar8);
        }
        else {
          uStack_268 = (long)iVar1;
          OSSL_PARAM_construct_size_t(&uStack_200,"size",&uStack_268);
          __s[4] = pcStack_1e0;
          __s[2] = pcStack_1f0;
          __s[3] = pcStack_1e8;
          *(uint *)__s = (uint)uStack_200;
          *(uint *)((long)__s + 4) = uStack_200._4_4_;
          *(uint *)(__s + 1) = uStack_1f8;
          *(uint *)((long)__s + 0xc) = uStack_1f4;
        }
        iVar3 = EVP_MAC_init(lVar8,phVar16->key,(long)phVar16->key_size);
        if (iVar3 == 0) goto LAB_00104a62;
        iVar3 = EVP_MAC_CTX_set_params(lVar8,apcStack_100);
        if (iVar3 == 0) goto LAB_00104a3b;
        iVar3 = EVP_MAC_update(lVar8,puStack_250,sVar9);
        if (iVar3 == 0) goto LAB_00104a14;
        uStack_220 = 0;
        if (iVar1 == 0) {
          uVar15 = EVP_MAC_CTX_get_mac_size(lVar8);
          if (uVar15 != uStack_268) goto LAB_00104d95;
          iVar1 = EVP_MAC_final(lVar8,&uStack_200,&uStack_220);
          if (iVar1 == 0) goto LAB_00104d47;
        }
        else {
          if (0x100 < uStack_268) goto LAB_00104b25;
          iVar1 = EVP_MAC_finalXOF(lVar8,&uStack_200);
          if (iVar1 == 0) goto LAB_00104bc1;
          uStack_220 = uStack_268;
        }
        EVP_MAC_CTX_free(lVar8);
        uVar15 = uStack_220;
        if (uStack_220 != uStack_268) goto LAB_001049ed;
        pcVar23 = phVar16->digest;
        iVar1 = bcmp(&uStack_200,pcVar23,uStack_220);
        if (iVar1 == 0) goto LAB_00103aff;
        printf("\x1b[1;31mmac mismatch (iter %d, outsize %d)\x1b[m\n",uVar22 & 0xffffffff,
               uVar15 & 0xffffffff);
        hexdump(pcVar23,uStack_268);
        hexdump(&uStack_200,uStack_268);
        uVar2 = 1;
      }
      if (pEStack_278 != (EVP_MD *)0x0) {
        pcVar23 = phVar16->hmac;
        if (pcVar23 == (char *)0x0) {
          sVar19 = phVar16->outsize;
          if (uVar22 == 0) {
            printf("[MD %zu] ",sVar19);
          }
          if ((sVar19 != 0) && (iVar1 = EVP_MD_get_size(pEStack_278), sVar19 != (long)iVar1))
          goto LAB_00104e31;
          uVar4 = phVar16->truncate;
          if (uVar4 == 0) {
            uVar4 = EVP_MD_get_size(pEStack_278);
          }
          iVar1 = phVar16->block_size;
          if ((iVar1 != 0) && (iVar3 = EVP_MD_get_block_size(pEStack_278), iVar3 != iVar1))
          goto LAB_00104de3;
          pEVar11 = (EVP_MD_CTX *)EVP_MD_CTX_new();
          if (pEVar11 == (EVP_MD_CTX *)0x0) goto LAB_00104d6e;
          iVar1 = EVP_MD_CTX_reset(pEVar11);
          phVar16 = phStack_240;
          if (iVar1 == 0) goto LAB_00104d20;
          iVar1 = EVP_DigestInit_ex(pEVar11,pEStack_278,(ENGINE *)0x0);
          if (iVar1 == 0) goto LAB_00104cf9;
          if ((phVar16->key != (char *)0x0) &&
             (iVar1 = EVP_MD_CTX_ctrl(pEVar11,0x1004,phVar16->key_size), iVar1 == 0))
          goto LAB_00104e0a;
          if ((phVar16->acpkm != 0) && (iVar1 = EVP_MD_CTX_ctrl(pEVar11,0x20), iVar1 == 0))
          goto LAB_00104e58;
          iVar1 = EVP_DigestUpdate(pEVar11,puStack_250,sVar9);
          if (iVar1 == 0) goto LAB_00104cd2;
          sVar19 = (size_t)(int)uVar4;
          pEVar7 = EVP_MD_CTX_md(pEVar11);
          uVar15 = EVP_MD_get_flags(pEVar7);
          if ((uVar15 & 2) == 0) {
            uVar12 = EVP_MD_CTX_get0_md();
            uVar5 = EVP_MD_get_size(uVar12);
            if (uVar5 != uVar4) goto LAB_00104ea6;
            iVar1 = EVP_DigestFinal_ex(pEVar11,(uchar *)&uStack_200,(uint *)apcStack_100);
            uVar5 = (uint)apcStack_100[0];
            if (iVar1 == 0) goto LAB_00104ecd;
          }
          else {
            iVar1 = EVP_DigestFinalXOF(pEVar11,&uStack_200,sVar19);
            uVar5 = uVar4;
            if (iVar1 == 0) goto LAB_00104e7f;
          }
          apcStack_100[0]._0_4_ = uVar5;
          EVP_MD_CTX_free(pEVar11);
          if ((uint)apcStack_100[0] != sVar19) goto LAB_00104dbc;
          pcVar23 = phVar16->digest;
          iVar1 = bcmp(&uStack_200,pcVar23,sVar19);
          if (iVar1 != 0) {
            printf("\x1b[1;31mdigest mismatch (iter %d, outsize %d)\x1b[m\n",uVar22 & 0xffffffff,
                   (ulong)uVar4);
            hexdump(pcVar23,sVar19);
            hexdump(&uStack_200,sVar19);
          }
          uVar2 = uVar2 | iVar1 != 0;
        }
        else {
          pcStack_248 = pcVar23;
          if (uVar22 == 0) {
            printf("[HMAC] ");
          }
          ctx = (HMAC_CTX *)HMAC_CTX_new();
          if (ctx == (HMAC_CTX *)0x0) goto LAB_00104ab0;
          pcVar23 = phVar16->key;
          iVar1 = phVar16->key_size;
          iVar3 = HMAC_Init_ex(ctx,pcVar23,iVar1,pEStack_278,(ENGINE *)0x0);
          if (iVar3 == 0) goto LAB_00104cab;
          iVar3 = HMAC_Update(ctx,puStack_250,sVar9);
          if (iVar3 == 0) goto LAB_00104c84;
          iVar3 = HMAC_Final(ctx,(uchar *)&uStack_200,(uint *)apcStack_100);
          if (iVar3 == 0) goto LAB_00104c5d;
          HMAC_CTX_free(ctx);
          pcVar18 = pcStack_248;
          uVar15 = phVar16->outsize;
          if (uVar15 != (uint)apcStack_100[0] && uVar15 != 0) goto LAB_00104ad7;
          iVar3 = bcmp(&uStack_200,pcStack_248,(ulong)(uint)apcStack_100[0]);
          if (iVar3 != 0) {
            printf("\x1b[1;31mhmac mismatch (iter %d)\x1b[m\n",uVar22 & 0xffffffff);
            hexdump(pcVar18,(ulong)(uint)apcStack_100[0]);
            hexdump(&uStack_200,(ulong)(uint)apcStack_100[0]);
          }
          uStack_234 = (uint)(iVar3 != 0);
          if (uVar22 == 0) {
            printf("[HMAC by EVP_MAC] ");
          }
          lVar8 = EVP_MAC_fetch(0,"HMAC",0);
          if (lVar8 == 0) goto LAB_00104c36;
          lVar13 = EVP_MAC_CTX_new(lVar8);
          if (lVar13 == 0) goto LAB_00104c0f;
          uStack_200 = "digest";
          uStack_1f8 = 4;
          pcStack_1f0 = (char *)EVP_MD_get0_name(pEStack_278);
          pcStack_1e8 = (char *)0x0;
          pcStack_1e0 = (char *)0xffffffffffffffff;
          uStack_1d8 = 0;
          uStack_1d0 = 0;
          uStack_1c8 = 0;
          uStack_1c0 = 0;
          uStack_1b8 = 0;
          iVar1 = EVP_MAC_init(lVar13,pcVar23,(long)iVar1,&uStack_200);
          if (iVar1 == 0) goto LAB_00104be8;
          iVar1 = EVP_MAC_update(lVar13,puStack_250,sVar9);
          if (iVar1 == 0) goto LAB_00104b9a;
          iVar1 = EVP_MAC_final(lVar13,apcStack_100,&sStack_260,0x40);
          if (iVar1 == 0) goto LAB_00104b73;
          EVP_MAC_CTX_free(lVar13);
          EVP_MAC_free(lVar8);
          pcVar23 = pcStack_248;
          if (sStack_260 != uVar15 && uVar15 != 0) goto LAB_00104b4c;
          iVar1 = bcmp(apcStack_100,pcStack_248,sStack_260);
          phVar16 = phStack_240;
          if (iVar1 != 0) {
            printf("\x1b[1;31mhmac mismatch (iter %d)\x1b[m\n",uVar22 & 0xffffffff);
            hexdump(pcVar23,sStack_260);
            hexdump(apcStack_100,sStack_260);
          }
          uVar2 = uVar2 | uStack_234 | iVar1 != 0;
        }
      }
      iVar1 = OBJ_sn2nid(pcStack_230);
      pcVar23 = "kuznyechik-cbc";
      if (iVar1 == 0x3f9) {
LAB_00103fd1:
        if (uVar22 == 0) {
          printf("[CMAC(%s)] ",pcVar23);
        }
        uVar15 = (ulong)phVar16->truncate;
        if (uVar15 == 0) {
          uVar15 = phVar16->outsize;
        }
        lVar8 = EVP_MAC_fetch(0,"CMAC",0);
        if (lVar8 == 0) goto LAB_00104951;
        lVar13 = EVP_MAC_CTX_new(lVar8);
        if (lVar13 == 0) goto LAB_00104978;
        uStack_200 = "cipher";
        uStack_1f8 = 4;
        pcStack_1e8 = (char *)0x0;
        pcStack_1e0 = (char *)0xffffffffffffffff;
        uStack_1c8 = 0;
        uStack_1c0 = 0;
        uStack_1d8 = 0;
        uStack_1d0 = 0;
        uStack_1b8 = 0;
        pcStack_1f0 = pcVar23;
        iVar1 = EVP_MAC_CTX_set_params(lVar13,&uStack_200);
        if (iVar1 == 0) goto LAB_0010499f;
        iVar1 = EVP_MAC_init(lVar13,phVar16->key,(long)phVar16->key_size,&uStack_200);
        if (iVar1 == 0) goto LAB_001048dc;
        iVar1 = EVP_MAC_update(lVar13,puStack_250,sVar9);
        if (iVar1 == 0) goto LAB_001048b5;
        iVar1 = EVP_MAC_final(lVar13,apcStack_100,&sStack_260);
        if (iVar1 == 0) goto LAB_00104903;
        EVP_MAC_CTX_free(lVar13);
        EVP_MAC_free(lVar8);
        if (sStack_260 < uVar15) goto LAB_0010492a;
        pcVar23 = phVar16->digest;
        iVar1 = bcmp(apcStack_100,pcVar23,uVar15);
        bVar24 = iVar1 != 0;
        if (bVar24) {
          printf("\x1b[1;31mcmac mismatch (iter %d)\x1b[m\n",uVar22 & 0xffffffff);
          hexdump(pcVar23,uVar15);
          hexdump(apcStack_100,sStack_260);
        }
      }
      else {
        bVar24 = false;
        if (iVar1 == 0x4a8) {
          pcVar23 = "magma-cbc";
          goto LAB_00103fd1;
        }
      }
      uVar15 = uVar22 + 1;
    } while (!bVar24 && uVar2 == 0);
    uVar2 = 1;
LAB_00104553:
    CRYPTO_free(pvStack_228);
    EVP_MAC_free(pvStack_258);
    EVP_MD_free(pEStack_278);
    pcVar23 = "\x1b[1;31mfail\x1b[m";
    if (0x1f < uVar22) {
      pcVar23 = "\x1b[1;32msuccess\x1b[m";
    }
    puts(pcVar23);
    uStack_238 = uStack_238 | uVar2;
    goto LAB_0010459c;
  }
LAB_00104ef4:
  ERR_print_errors_fp(_stderr);
  OPENSSL_die("buf = OPENSSL_malloc(tv->psize + shifts)",
              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
              ,0x2fb);
LAB_00104f1b:
  ERR_print_errors_fp(_stderr);
  pcVar18 = 
  "(md = (EVP_MD *)EVP_get_digestbyname(tv->algname)) || (md = EVP_MD_fetch(NULL, tv->algname, NULL)) || (mac = EVP_MAC_fetch(NULL, tv->algname, NULL))"
  ;
  pcVar23 = "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c";
  OPENSSL_die("(md = (EVP_MD *)EVP_get_digestbyname(tv->algname)) || (md = EVP_MD_fetch(NULL, tv->algname, NULL)) || (mac = EVP_MAC_fetch(NULL, tv->algname, NULL))"
              ,
              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
              ,0x2f2);
  pcVar21 = (char *)0x0;
  while (pcVar21 < pcVar23) {
    lVar8 = 0x10;
    for (; (lVar8 != 0 && (pcVar21 < pcVar23)); pcVar21 = pcVar21 + 1) {
      pcVar17 = "";
      if (lVar8 == 0x10) {
        pcVar17 = " ";
      }
      printf("%s%02x",pcVar17,(ulong)(byte)pcVar18[(long)pcVar21]);
      lVar8 = lVar8 + -1;
    }
  }
  putchar(10);
  return;
LAB_0010469f:
  ERR_print_errors_fp(_stderr);
  OPENSSL_die("EVP_DigestInit(ctx, dgst)",
              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
              ,0x348);
LAB_001046c6:
  ERR_print_errors_fp(_stderr);
  OPENSSL_die("EVP_DigestUpdate(ctx, ibuf + shifts, len)",
              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
              ,0x349);
LAB_001046ed:
  ERR_print_errors_fp(_stderr);
  OPENSSL_die("EVP_DigestFinal(ctx, md, NULL)",
              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
              ,0x34a);
LAB_00104714:
  ERR_print_errors_fp(_stderr);
  OPENSSL_die("EVP_DigestUpdate(ctx2, md, mdlen)",
              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
              ,0x34b);
LAB_0010473b:
  OPENSSL_die("assertion failed: EVP_MD_CTX_block_size(ctx2) == tv->block_size",
              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
              ,0x336);
LAB_00104753:
  OPENSSL_die("assertion failed: mdlen == tv->outsize",
              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
              ,0x339);
LAB_0010476b:
  OPENSSL_die("assertion failed: EVP_MD_CTX_size(ctx2) == tv->outsize",
              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
              ,0x335);
LAB_00104783:
  ERR_print_errors_fp(_stderr);
  OPENSSL_die("ctx2 = EVP_MD_CTX_new()",
              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
              ,0x331);
LAB_001047aa:
  ERR_print_errors_fp(_stderr);
  OPENSSL_die("EVP_DigestInit(ctx2, dgst)",
              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
              ,0x332);
LAB_001047d1:
  OPENSSL_die("assertion failed: EVP_MD_block_size(dgst) == tv->block_size",
              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
              ,0x334);
LAB_001047e9:
  ERR_print_errors_fp(_stderr);
  OPENSSL_die("ctx = EVP_MD_CTX_new()",
              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
              ,0x330);
LAB_00104810:
  OPENSSL_die("assertion failed: EVP_MD_is_a(EVP_MD_CTX_md(ctx2), tv->algname)",
              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
              ,0x333);
LAB_00104828:
  OPENSSL_die("assertion failed: EVP_MD_is_a(dgst, tv->algname)",
              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
              ,0x32e);
LAB_00104840:
  ERR_print_errors_fp(_stderr);
  OPENSSL_die("ibuf = OPENSSL_zalloc(SUPER_SIZE + shifts)",
              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
              ,0x324);
LAB_00104867:
  ERR_print_errors_fp(_stderr);
  OPENSSL_die("md = OPENSSL_zalloc(mdlen + shifts)",
              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
              ,0x33a);
LAB_0010488e:
  ERR_print_errors_fp(_stderr);
  OPENSSL_die("EVP_DigestFinal(ctx2, md, &len)",
              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
              ,0x351);
LAB_001048b5:
  ERR_print_errors_fp(_stderr);
  OPENSSL_die("EVP_MAC_update(ctx, (unsigned char *)plaintext, t->psize)",
              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
              ,0x26d);
LAB_001048dc:
  ERR_print_errors_fp(_stderr);
  OPENSSL_die("EVP_MAC_init(ctx, (const unsigned char *)t->key, t->key_size, params)",
              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
              ,0x26c);
LAB_00104903:
  ERR_print_errors_fp(_stderr);
  OPENSSL_die("EVP_MAC_final(ctx, out, &len, sizeof(out))",
              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
              ,0x26e);
LAB_0010492a:
  ERR_print_errors_fp(_stderr);
  OPENSSL_die("outsize <= len",
              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
              ,0x274);
LAB_00104951:
  ERR_print_errors_fp(_stderr);
  OPENSSL_die("cmac = EVP_MAC_fetch(NULL, \"CMAC\", NULL)",
              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
              ,0x264);
LAB_00104978:
  ERR_print_errors_fp(_stderr);
  OPENSSL_die("ctx = EVP_MAC_CTX_new(cmac)",
              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
              ,0x266);
LAB_0010499f:
  ERR_print_errors_fp(_stderr);
  OPENSSL_die("EVP_MAC_CTX_set_params(ctx, params)",
              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
              ,0x26b);
LAB_001049c6:
  ERR_print_errors_fp(_stderr);
  OPENSSL_die("ctx = EVP_MAC_CTX_new(mac)",
              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
              ,0x290);
LAB_001049ed:
  ERR_print_errors_fp(_stderr);
  OPENSSL_die("len == outsize",
              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
              ,0x2ab);
LAB_00104a14:
  ERR_print_errors_fp(_stderr);
  OPENSSL_die("EVP_MAC_update(ctx, (unsigned char *)plaintext, t->psize)",
              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
              ,0x29d);
LAB_00104a3b:
  ERR_print_errors_fp(_stderr);
  OPENSSL_die("EVP_MAC_CTX_set_params(ctx, params)",
              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
              ,0x29c);
LAB_00104a62:
  ERR_print_errors_fp(_stderr);
  OPENSSL_die("EVP_MAC_init(ctx, (const unsigned char *)t->key, t->key_size, NULL)",
              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
              ,0x29b);
LAB_00104a89:
  ERR_print_errors_fp(_stderr);
  OPENSSL_die("(dgst = (EVP_MD *)EVP_get_digestbyname(tv->algname)) || (dgst = EVP_MD_fetch(NULL, tv->algname, NULL))"
              ,
              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
              ,0x32d);
LAB_00104ab0:
  ERR_print_errors_fp(_stderr);
  OPENSSL_die("ctx = HMAC_CTX_new()",
              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
              ,0x1ff);
LAB_00104ad7:
  ERR_print_errors_fp(_stderr);
  OPENSSL_die("len == t->outsize",
              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
              ,0x206);
LAB_00104afe:
  ERR_print_errors_fp(_stderr);
  OPENSSL_die("EVP_MAC_CTX_get_mac_size(ctx) == t->outsize",
              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
              ,0x292);
LAB_00104b25:
  ERR_print_errors_fp(_stderr);
  OPENSSL_die("outsize <= sizeof(out)",
              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
              ,0x2a2);
LAB_00104b4c:
  ERR_print_errors_fp(_stderr);
  OPENSSL_die("len == t->outsize",
              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
              ,0x229);
LAB_00104b73:
  ERR_print_errors_fp(_stderr);
  OPENSSL_die("EVP_MAC_final(ctx, out, &len, sizeof(out))",
              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
              ,0x224);
LAB_00104b9a:
  ERR_print_errors_fp(_stderr);
  OPENSSL_die("EVP_MAC_update(ctx, (unsigned char *)plaintext, t->psize)",
              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
              ,0x223);
LAB_00104bc1:
  ERR_print_errors_fp(_stderr);
  OPENSSL_die("EVP_MAC_finalXOF(ctx, out, outsize)",
              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
              ,0x2a3);
LAB_00104be8:
  ERR_print_errors_fp(_stderr);
  OPENSSL_die("EVP_MAC_init(ctx, (const unsigned char *)t->key, t->key_size, params)",
              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
              ,0x222);
LAB_00104c0f:
  ERR_print_errors_fp(_stderr);
  OPENSSL_die("ctx = EVP_MAC_CTX_new(hmac)",
              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
              ,0x21c);
LAB_00104c36:
  ERR_print_errors_fp(_stderr);
  OPENSSL_die("hmac = EVP_MAC_fetch(NULL, \"HMAC\", NULL)",
              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
              ,0x21a);
LAB_00104c5d:
  ERR_print_errors_fp(_stderr);
  OPENSSL_die("HMAC_Final(ctx, md, &len)",
              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
              ,0x202);
LAB_00104c84:
  ERR_print_errors_fp(_stderr);
  OPENSSL_die("HMAC_Update(ctx, (const unsigned char *)plaintext, t->psize)",
              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
              ,0x201);
LAB_00104cab:
  ERR_print_errors_fp(_stderr);
  OPENSSL_die("HMAC_Init_ex(ctx, t->key, t->key_size, type, NULL)",
              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
              ,0x200);
LAB_00104cd2:
  ERR_print_errors_fp(_stderr);
  OPENSSL_die("EVP_DigestUpdate(ctx, plaintext, t->psize)",
              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
              ,0x2d0);
LAB_00104cf9:
  ERR_print_errors_fp(_stderr);
  OPENSSL_die("EVP_DigestInit_ex(ctx, type, NULL)",
              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
              ,0x2c9);
LAB_00104d20:
  ERR_print_errors_fp(_stderr);
  OPENSSL_die("EVP_MD_CTX_init(ctx)",
              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
              ,0x2c8);
LAB_00104d47:
  ERR_print_errors_fp(_stderr);
  OPENSSL_die("EVP_MAC_final(ctx, out, &len, sizeof(out))",
              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
              ,0x2a7);
LAB_00104d6e:
  ERR_print_errors_fp(_stderr);
  OPENSSL_die("ctx = EVP_MD_CTX_new()",
              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
              ,0x2c7);
LAB_00104d95:
  ERR_print_errors_fp(_stderr);
  OPENSSL_die("EVP_MAC_CTX_get_mac_size(ctx) == outsize",
              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
              ,0x2a6);
LAB_00104dbc:
  ERR_print_errors_fp(_stderr);
  OPENSSL_die("len == outsize",
              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
              ,0x2dd);
LAB_00104de3:
  ERR_print_errors_fp(_stderr);
  OPENSSL_die("EVP_MD_block_size(type) == t->block_size",
              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
              ,0x2c5);
LAB_00104e0a:
  ERR_print_errors_fp(_stderr);
  OPENSSL_die("EVP_MD_CTX_ctrl(ctx, EVP_MD_CTRL_SET_KEY, t->key_size, (void *)t->key)",
              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
              ,0x2cc);
LAB_00104e31:
  ERR_print_errors_fp(_stderr);
  OPENSSL_die("EVP_MD_size(type) == t->outsize",
              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
              ,0x2bd);
LAB_00104e58:
  ERR_print_errors_fp(_stderr);
  OPENSSL_die("EVP_MD_CTX_ctrl(ctx, EVP_CTRL_KEY_MESH, t->acpkm, t->acpkm_t? (void *)&t->acpkm_t : NULL)"
              ,
              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
              ,0x2cf);
LAB_00104e7f:
  ERR_print_errors_fp(_stderr);
  OPENSSL_die("EVP_DigestFinalXOF(ctx, out, outsize)",
              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
              ,0x2d5);
LAB_00104ea6:
  ERR_print_errors_fp(_stderr);
  OPENSSL_die("EVP_MD_CTX_size(ctx) == outsize",
              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
              ,0x2d8);
LAB_00104ecd:
  ERR_print_errors_fp(_stderr);
  OPENSSL_die("EVP_DigestFinal_ex(ctx, out, &len)",
              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
              ,0x2d9);
  goto LAB_00104ef4;
}

Assistant:

void warn_all_untested(void)
{
    if (engine_is_available("gost")) {
        ENGINE *eng;

        T(eng = ENGINE_by_id("gost"));
        T(ENGINE_init(eng));

        ENGINE_DIGESTS_PTR fn_c;
        T(fn_c = ENGINE_get_digests(eng));
        const int *nids;
        int n, k;
        n = fn_c(eng, NULL, &nids, 0);
        for (k = 0; k < n; ++k)
            warn_if_untested(ENGINE_get_digest(eng, nids[k]), NULL);
        ENGINE_finish(eng);
        ENGINE_free(eng);
    }
    if (OSSL_PROVIDER_available(NULL, "gostprov")) {
        OSSL_PROVIDER *prov;

        T(prov = OSSL_PROVIDER_load(NULL, "gostprov"));
        EVP_MD_do_all_provided(NULL,
                               (void (*)(EVP_MD *, void *))warn_if_untested,
                               prov);

        OSSL_PROVIDER_unload(prov);
    }
}